

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void Bitmap_Operation::Save
               (string *path,Image *image,uint32_t startX,uint32_t startY,uint32_t width,
               uint32_t height)

{
  uint8_t uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  _Ios_Openmode __a;
  size_type sVar6;
  uchar *puVar7;
  ulong __n;
  uchar *puVar8;
  undefined8 uVar9;
  int in_ECX;
  int in_EDX;
  ImageTemplate<unsigned_char> *in_RSI;
  _Ios_Openmode in_EDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  uint32_t rowId;
  vector<unsigned_char,_std::allocator<unsigned_char>_> temp;
  uint8_t *imageY;
  uint32_t rowSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  fstream file;
  BitmapInfoHeader info;
  BitmapFileHeader header;
  uint32_t lineLength;
  uint8_t colorCount;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pallete;
  uint32_t palleteSize;
  undefined7 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc47;
  allocator_type *in_stack_fffffffffffffc48;
  BitmapInfoHeader *in_stack_fffffffffffffc50;
  size_type in_stack_fffffffffffffc58;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffc60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  char *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  uint local_318;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_312;
  uchar *local_2f8;
  uint32_t local_2f0;
  long local_2d0 [2];
  BitmapInfoHeader local_2c0 [9];
  BitmapInfoHeader local_c0;
  BitmapFileHeader local_84;
  uint local_70;
  byte local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  int local_24;
  uint32_t local_20;
  uint32_t local_1c;
  int local_18;
  int local_14;
  ImageTemplate<unsigned_char> *local_10;
  _Ios_Openmode local_8;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffc60,(uint32_t)(in_stack_fffffffffffffc58 >> 0x20),
             (uint32_t)in_stack_fffffffffffffc58,
             (uint32_t)((ulong)in_stack_fffffffffffffc50 >> 0x20),
             (uint32_t)in_stack_fffffffffffffc50);
  local_24 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13c5b7);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
  if (uVar1 == '\x01') {
    generateGrayScalePallete();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
    local_24 = (int)sVar6;
  }
  local_69 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(local_10);
  local_70 = local_1c * local_69;
  if ((local_70 & 3) != 0) {
    local_70 = ((local_70 >> 2) + 1) * 4;
  }
  BitmapFileHeader::BitmapFileHeader(&local_84);
  BitmapInfoHeader::BitmapInfoHeader
            ((BitmapInfoHeader *)CONCAT17(in_stack_fffffffffffffc47,in_stack_fffffffffffffc40));
  uVar5 = local_84.overallSize;
  uVar4 = BitmapInfoHeader::size(&local_c0);
  local_84.bfSize = uVar5 + uVar4 + local_24 + local_70 * local_20;
  uVar5 = BitmapInfoHeader::size(&local_c0);
  local_84.bfOffBits = local_84.overallSize + uVar5 + local_24;
  BitmapInfoHeader::setWidth(&local_c0,local_1c);
  BitmapInfoHeader::setHeight(&local_c0,local_20);
  BitmapInfoHeader::setColorCount(&local_c0,(ushort)local_69);
  BitmapInfoHeader::setImageSize(&local_c0,local_70 * local_20);
  std::fstream::fstream(local_2d0);
  __a = std::operator|(_S_out,_S_trunc);
  std::operator|(__a,_S_bin);
  std::fstream::open((string *)local_2d0,local_8);
  bVar2 = std::ios::operator!((ios *)((long)local_2d0 + *(long *)(local_2d0[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x13c90c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58,(allocator_type *)in_stack_fffffffffffffc50);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x13c932);
    BitmapFileHeader::get
              ((BitmapFileHeader *)in_stack_fffffffffffffc50,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13c963);
    std::ostream::write((char *)local_2c0,(long)puVar7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc60,
               in_stack_fffffffffffffc58);
    BitmapInfoHeader::get
              (in_stack_fffffffffffffc50,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc48);
    puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13c9c0);
    BitmapInfoHeader::size(&local_c0);
    std::ostream::write((char *)local_2c0,(long)puVar7);
    bVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc50);
    if (!bVar3) {
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13ca25);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_40);
      std::ostream::write((char *)local_2c0,(long)puVar7);
    }
    std::ostream::flush();
    uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_10);
    local_2f0 = uVar5;
    puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_10);
    local_2f8 = puVar7 + (ulong)(local_14 * (uint)local_69) +
                         (ulong)((local_18 + -1 + local_20) * local_2f0);
    __n = (ulong)local_70;
    local_312.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._1_1_ = 0;
    this = &local_312;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x13cb35);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this,__n,(value_type_conflict2 *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48)
    ;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x13cb63);
    for (local_318 = 0; local_318 < local_20; local_318 = local_318 + 1) {
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13cb94);
      memcpy(puVar8,local_2f8,(ulong)local_1c * (ulong)local_69);
      in_stack_fffffffffffffc50 = local_2c0;
      puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13cbd0);
      std::ostream::write((char *)in_stack_fffffffffffffc50,(long)puVar8);
      std::ostream::flush();
      local_2f8 = local_2f8 + -(ulong)local_2f0;
    }
    bVar2 = std::ios::operator!((ios *)((long)local_2d0 + *(long *)(local_2d0[0] + -0x18)));
    if ((bVar2 & 1) == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50)
      ;
      std::fstream::~fstream(local_2d0);
      BitmapInfoHeader::~BitmapInfoHeader((BitmapInfoHeader *)0x13cd2b);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50)
      ;
      return;
    }
    uVar9 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)CONCAT44(uVar5,in_stack_fffffffffffffc70),(char *)puVar7);
    __cxa_throw(uVar9,&imageException::typeinfo,imageException::~imageException);
  }
  uVar9 = __cxa_allocate_exception(0x28);
  imageException::imageException
            ((imageException *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
             in_stack_fffffffffffffc68);
  __cxa_throw(uVar9,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Save( const std::string & path, const PenguinV_Image::Image & image, uint32_t startX, uint32_t startY,
               uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, startX, startY, width, height );

        uint32_t palleteSize = 0;
        std::vector < uint8_t > pallete;

        // Create a pallete only for gray-scale image
        if( image.colorCount() == 1u ) {
            pallete = generateGrayScalePallete();
            palleteSize = static_cast<uint32_t>( pallete.size() );
        }

        const uint8_t colorCount = image.colorCount();

        uint32_t lineLength = width * colorCount;
        if( lineLength % BITMAP_ALIGNMENT != 0 )
            lineLength = (lineLength / BITMAP_ALIGNMENT + 1) * BITMAP_ALIGNMENT;

        BitmapFileHeader header;
        BitmapInfoHeader info;

        header.bfSize    = header.overallSize + info.size() + palleteSize + lineLength * height;
        header.bfOffBits = header.overallSize + info.size() + palleteSize;

        info.setWidth     ( width );
        info.setHeight    ( height );
        info.setColorCount( colorCount );
        info.setImageSize ( lineLength * height );

        std::fstream file;
        file.open( path, std::fstream::out | std::fstream::trunc | std::fstream::binary );

        if( !file )
            throw imageException( "Cannot create file for saving" );

        std::vector < uint8_t > data( sizeof( BitmapFileHeader ) );

        header.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), header.overallSize );

        data.resize( sizeof( BitmapInfoHeader ) );

        info.get( data );
        file.write( reinterpret_cast<const char *>(data.data()), info.size() );

        if( !pallete.empty() )
            file.write( reinterpret_cast<const char *>(pallete.data()), static_cast<std::streamsize>(pallete.size()) );

        file.flush();

        const uint32_t rowSize = image.rowSize();

        const uint8_t * imageY = image.data() + (startY + height - 1) * rowSize + startX * colorCount;

        std::vector < uint8_t > temp( lineLength, 0 );

        for( uint32_t rowId = 0; rowId < height; ++rowId, imageY -= rowSize ) {
            memcpy( temp.data(), imageY, sizeof( uint8_t ) * width * colorCount );

            file.write( reinterpret_cast<const char *>(temp.data()), lineLength );
            file.flush();
        }

        if( !file )
            throw imageException( "failed to write data into file" );
    }